

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O3

bool EV_DoDoor(EVlDoor type,line_t_conflict *line,AActor *thing,int tag,double speed,int delay,
              int lock,int lightTag,bool boomgen,int topcountdown)

{
  player_t *ppVar1;
  DBot *pDVar2;
  PClass *pPVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  DDoor *pDVar8;
  undefined4 extraout_var;
  DSeqNode *curseq;
  sector_t_conflict *psVar10;
  DSectorEffect *pDVar11;
  FSoundID local_3c;
  FSectorTagIterator local_38;
  PClass *pPVar9;
  
  if ((lock != 0) && (bVar4 = P_CheckKeys(thing,lock,tag != 0), !bVar4)) {
    return false;
  }
  if (tag != 0) {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    bVar4 = false;
    local_38.searchtag = tag;
    while (uVar6 = FSectorTagIterator::Next(&local_38), -1 < (int)uVar6) {
      psVar10 = sectors + uVar6;
      bVar5 = sector_t::PlaneMoving(psVar10,1);
      if (!bVar5) {
        pDVar8 = (DDoor *)M_Malloc_Dbg(0x88,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
        bVar4 = true;
        DDoor::DDoor(pDVar8,(sector_t *)psVar10,type,speed,delay,lightTag,topcountdown);
      }
    }
    return bVar4;
  }
  if (line == (line_t_conflict *)0x0) {
    return false;
  }
  if (line->sidedef[1] == (side_t *)0x0) {
    local_3c.ID = S_FindSound("*usefail");
    S_Sound(thing,2,&local_3c,1.0,1.0);
    return false;
  }
  psVar10 = line->sidedef[1]->sector;
  bVar4 = sector_t::PlaneMoving(psVar10,1);
  if (!bVar4) {
    pDVar8 = (DDoor *)M_Malloc_Dbg(0x88,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
    DDoor::DDoor(pDVar8,(sector_t *)psVar10,type,speed,delay,lightTag,topcountdown);
    return true;
  }
  if (boomgen) {
    return false;
  }
  pDVar11 = (psVar10->ceilingdata).field_0.p;
  if (pDVar11 == (DSectorEffect *)0x0) {
LAB_003eb1a0:
    pDVar11 = (DSectorEffect *)0x0;
  }
  else if (((pDVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (psVar10->ceilingdata).field_0.p = (DSectorEffect *)0x0;
    goto LAB_003eb1a0;
  }
  pPVar3 = DDoor::RegistrationInfo.MyClass;
  pPVar9 = (pDVar11->super_DThinker).super_DObject.Class;
  if (pPVar9 == (PClass *)0x0) {
    iVar7 = (**(pDVar11->super_DThinker).super_DObject._vptr_DObject)(pDVar11);
    pPVar9 = (PClass *)CONCAT44(extraout_var,iVar7);
    (pDVar11->super_DThinker).super_DObject.Class = pPVar9;
  }
  bVar4 = pPVar9 != (PClass *)0x0;
  if (pPVar9 != pPVar3 && bVar4) {
    do {
      pPVar9 = pPVar9->ParentClass;
      bVar4 = pPVar9 != (PClass *)0x0;
      if (pPVar9 == pPVar3) break;
    } while (pPVar9 != (PClass *)0x0);
  }
  if (!bVar4) {
    return false;
  }
  pDVar8 = (DDoor *)(psVar10->ceilingdata).field_0.p;
  if (pDVar8 != (DDoor *)0x0) {
    if (((pDVar8->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
         super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003eb220;
    (psVar10->ceilingdata).field_0.p = (DSectorEffect *)0x0;
  }
  pDVar8 = (DDoor *)0x0;
LAB_003eb220:
  if (type != doorRaise) {
    return false;
  }
  if (pDVar8->m_Type != doorRaise) {
    return false;
  }
  if (pDVar8->m_Direction == -1) {
    pDVar8->m_Direction = 1;
    DDoor::DoorSound(pDVar8,true,(DSeqNode *)0x0);
    return false;
  }
  if (((line->activation & 0x210) == 0) && (ppVar1 = thing->player, ppVar1 != (player_t *)0x0)) {
    pDVar2 = (ppVar1->Bot).field_0.p;
    if (pDVar2 != (DBot *)0x0) {
      if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        return false;
      }
      (ppVar1->Bot).field_0.p = (DBot *)0x0;
    }
    pDVar8->m_Direction = -1;
    curseq = SN_CheckSequence((sector_t *)psVar10,2);
    DDoor::DoorSound(pDVar8,false,curseq);
    return true;
  }
  return false;
}

Assistant:

bool EV_DoDoor (DDoor::EVlDoor type, line_t *line, AActor *thing,
				int tag, double speed, int delay, int lock, int lightTag, bool boomgen, int topcountdown)
{
	bool		rtn = false;
	int 		secnum;
	sector_t*	sec;

	if (lock != 0 && !P_CheckKeys (thing, lock, tag != 0))
		return false;

	if (tag == 0)
	{		// [RH] manual door
		if (!line)
			return false;

		// if the wrong side of door is pushed, give oof sound
		if (line->sidedef[1] == NULL)			// killough
		{
			S_Sound (thing, CHAN_VOICE, "*usefail", 1, ATTN_NORM);
			return false;
		}

		// get the sector on the second side of activating linedef
		sec = line->sidedef[1]->sector;
		secnum = int(sec-sectors);

		// if door already has a thinker, use it
		if (sec->PlaneMoving(sector_t::ceiling))
		{
			// Boom used remote door logic for generalized doors, even if they are manual
			if (boomgen)
				return false;
			if (sec->ceilingdata->IsKindOf (RUNTIME_CLASS(DDoor)))
			{
				DDoor *door = barrier_cast<DDoor *>(sec->ceilingdata);

				// ONLY FOR "RAISE" DOORS, NOT "OPEN"s
				if (door->m_Type == DDoor::doorRaise && type == DDoor::doorRaise)
				{
					if (door->m_Direction == -1)
					{
						door->m_Direction = 1;	// go back up
						door->DoorSound (true);	// [RH] Make noise
					}
					else if (!(line->activation & (SPAC_Push|SPAC_MPush)))
						// [RH] activate push doors don't go back down when you
						//		run into them (otherwise opening them would be
						//		a real pain).
					{
						if (!thing->player || thing->player->Bot != NULL)
							return false;	// JDC: bad guys never close doors
											//Added by MC: Neither do bots.

						door->m_Direction = -1;	// start going down immediately

						// Start the door close sequence.
						door->DoorSound(false, SN_CheckSequence(sec, CHAN_CEILING));
						return true;
					}
					else
					{
						return false;
					}
				}
			}
			return false;
		}
		if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
			rtn = true;
	}
	else
	{	// [RH] Remote door

		FSectorTagIterator it(tag);
		while ((secnum = it.Next()) >= 0)
		{
			sec = &sectors[secnum];
			// if the ceiling is already moving, don't start the door action
			if (sec->PlaneMoving(sector_t::ceiling))
				continue;

			if (new DDoor (sec, type, speed, delay, lightTag, topcountdown))
				rtn = true;
		}
				
	}
	return rtn;
}